

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O2

void __thiscall
OutputBox::StartUnitaryBox(OutputBox *this,string *dataset_name,size_t n_things_todo)

{
  uint uVar1;
  uint uVar2;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string complete_pre_message;
  ProgressBar local_98;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 dataset_name,":");
  PrintData(this,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  local_98.prev_ = (size_t)&local_98.gap_;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)this->pre_spaces_);
  std::operator+(&complete_pre_message,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 "|  ");
  std::__cxx11::string::~string((string *)&local_98);
  uVar1 = this->pre_spaces_;
  uVar2 = this->bar_width_;
  std::__cxx11::string::string((string *)&local_d8,(string *)&complete_pre_message);
  std::__cxx11::string::string((string *)&local_f8," |",&local_f9);
  ProgressBar::ProgressBar(&local_98,n_things_todo,1,(ulong)(uVar1 + uVar2),&local_d8,&local_f8);
  ProgressBar::operator=(&this->pb,&local_98);
  ProgressBar::~ProgressBar(&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  ProgressBar::Start(&this->pb);
  std::__cxx11::string::~string((string *)&complete_pre_message);
  return;
}

Assistant:

void StartUnitaryBox(const std::string &dataset_name, const size_t n_things_todo)
    {
        PrintData(dataset_name + ":");
        std::string complete_pre_message = std::string(pre_spaces_, ' ') + "|  ";
        pb = ProgressBar(n_things_todo, 1, bar_width_ + pre_spaces_, complete_pre_message, " |");
        pb.Start();
    }